

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

char * __thiscall Memory::InlineCacheAllocator::AllocZero(InlineCacheAllocator *this,size_t nbytes)

{
  char *__s;
  
  __s = Alloc(this,nbytes);
  memset(__s,0,nbytes);
  memset(__s + nbytes,0,(nbytes + 0x1f & 0xffffffffffffffe0) - nbytes);
  return __s;
}

Assistant:

char * AllocZero(DECLSPEC_GUARD_OVERFLOW size_t nbytes)
    {
        char * buffer = Alloc(nbytes);
        memset(buffer, 0, nbytes);
#if DBG
        // Since we successfully allocated, we shouldn't have integer overflow here
        memset(buffer + nbytes, 0, Math::Align(nbytes, ArenaAllocatorBase::ObjectAlignment) - nbytes);
#endif
        return buffer;
    }